

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

quaternion * quaternion_set_from_axis_anglev3(quaternion *self,vector3 *axis,float angle)

{
  float fVar1;
  undefined8 uVar2;
  double dVar3;
  quaternion *pqVar4;
  float fVar5;
  float local_18;
  float fStack_14;
  
  fVar1 = (axis->field_0).v[2];
  uVar2 = *(undefined8 *)&axis->field_0;
  dVar3 = sin((double)(angle * 0.5));
  fVar5 = (float)dVar3;
  dVar3 = cos((double)(angle * 0.5));
  local_18 = (float)uVar2;
  fStack_14 = (float)((ulong)uVar2 >> 0x20);
  *(ulong *)&self->field_0 = CONCAT44(fVar5 * fStack_14,fVar5 * local_18);
  (self->field_0).q[2] = fVar1 * fVar5;
  (self->field_0).q[3] = (float)dVar3;
  pqVar4 = quaternion_normalize(self);
  return pqVar4;
}

Assistant:

HYPAPI struct quaternion *quaternion_set_from_axis_anglev3(struct quaternion *self, const struct vector3 *axis, HYP_FLOAT angle)
{
	return quaternion_set_from_axis_anglef3(self, axis->x, axis->y, axis->z, angle);
}